

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setdelegate(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQDelegable *this;
  SQRESULT SVar3;
  SQInteger SVar4;
  undefined8 in_RSI;
  HSQUIRRELVM in_RDI;
  SQObjectType type;
  SQObjectPtr *mt;
  SQObjectPtr *self;
  SQChar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  SQObjectType SVar5;
  undefined4 in_stack_ffffffffffffffd4;
  SQObjectType SVar6;
  
  SVar6 = (SQObjectType)((ulong)in_RSI >> 0x20);
  pSVar2 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (SQInteger)in_stack_ffffffffffffffc8);
  this = (SQDelegable *)
         SQVM::GetUp((SQVM *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (SQInteger)in_stack_ffffffffffffffc8);
  SVar5 = (pSVar2->super_SQObject)._type;
  if (SVar5 == OT_TABLE) {
    if (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0xa000020) {
      SVar6 = SVar5;
      bVar1 = SQDelegable::SetDelegate(this,(SQTable *)0xa0000200a000020);
      if (!bVar1) {
        SVar3 = sq_throwerror((HSQUIRRELVM)CONCAT44(SVar6,SVar5),in_stack_ffffffffffffffc8);
        return SVar3;
      }
      SQVM::Pop((SQVM *)0x118f55);
    }
    else {
      if (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted != 0x1000001) {
        SVar4 = sq_aux_invalidtype(in_RDI,SVar6);
        return SVar4;
      }
      SQDelegable::SetDelegate(this,(SQTable *)0xa0000200a000020);
      SQVM::Pop((SQVM *)0x118f80);
    }
  }
  else {
    if (SVar5 != OT_USERDATA) {
      SVar4 = sq_aux_invalidtype(in_RDI,SVar6);
      return SVar4;
    }
    if (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0xa000020) {
      SQDelegable::SetDelegate(this,(SQTable *)0xa0000800a000080);
      SQVM::Pop((SQVM *)0x118fcf);
    }
    else {
      if (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted != 0x1000001) {
        SVar4 = sq_aux_invalidtype(in_RDI,SVar6);
        return SVar4;
      }
      SQDelegable::SetDelegate(this,(SQTable *)0xa0000800a000080);
      SQVM::Pop((SQVM *)0x118ffa);
    }
  }
  return 0;
}

Assistant:

SQRESULT sq_setdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self = stack_get(v, idx);
    SQObjectPtr &mt = v->GetUp(-1);
    SQObjectType type = sq_type(self);
    switch(type) {
    case OT_TABLE:
        if(sq_type(mt) == OT_TABLE) {
            if(!_table(self)->SetDelegate(_table(mt))) {
                return sq_throwerror(v, _SC("delagate cycle"));
            }
            v->Pop();
        }
        else if(sq_type(mt)==OT_NULL) {
            _table(self)->SetDelegate(NULL); v->Pop(); }
        else return sq_aux_invalidtype(v,type);
        break;
    case OT_USERDATA:
        if(sq_type(mt)==OT_TABLE) {
            _userdata(self)->SetDelegate(_table(mt)); v->Pop(); }
        else if(sq_type(mt)==OT_NULL) {
            _userdata(self)->SetDelegate(NULL); v->Pop(); }
        else return sq_aux_invalidtype(v, type);
        break;
    default:
            return sq_aux_invalidtype(v, type);
        break;
    }
    return SQ_OK;
}